

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsByPartitionAsync
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  uint uVar1;
  threadData *ptVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  packaged_task<void_()> *__args;
  long lVar6;
  int i;
  int partitionCountThread;
  uint local_124;
  int local_120;
  int local_11c;
  __shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2> local_118;
  long local_108;
  int *local_100;
  int *local_f8;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  long local_d8;
  double *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  BeagleCPUImpl<double,_1,_0> *local_a0;
  packaged_task<void_()> threadTask;
  unique_lock<std::mutex> l;
  
  uVar1 = this->kNumThreads;
  __args = (packaged_task<void_()> *)(ulong)uVar1;
  lVar6 = 0x88;
  local_11c = partitionCount / (int)uVar1;
  uVar4 = (long)partitionCount % (long)(int)uVar1 & 0xffffffff;
  if ((int)uVar1 < partitionCount) {
    partitionCount = uVar1;
  }
  iVar5 = 0;
  local_120 = local_11c + 1;
  local_d8 = (ulong)(uint)(~(partitionCount >> 0x1f) & partitionCount) << 4;
  lVar3 = 0;
  local_100 = bufferIndices;
  local_f8 = categoryWeightsIndices;
  local_f0 = stateFrequenciesIndices;
  local_e8 = cumulativeScaleIndices;
  local_e0 = partitionIndices;
  while (local_d8 != lVar3) {
    partitionCountThread = local_11c;
    if ((int)uVar4 == 0) {
      local_124 = 0;
    }
    else {
      local_124 = (int)uVar4 - 1;
      partitionCountThread = local_120;
    }
    local_118 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 )ZEXT816(0x251);
    local_a8 = local_100 + iVar5;
    local_b0 = local_f8 + iVar5;
    local_b8 = local_f0 + iVar5;
    local_c0 = local_e8 + iVar5;
    local_c8 = local_e0 + iVar5;
    local_d0 = outSumLogLikelihoodByPartition + iVar5;
    local_108 = lVar3;
    local_a0 = this;
    std::
    _Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
    ::
    _Bind<beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int&,double*>
              ((_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
                *)&l,(offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)&local_118,&local_a0,&local_a8
               ,&local_b0,&local_b8,&local_c0,&local_c8,&partitionCountThread,&local_d0);
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              ((packaged_task<void()> *)&threadTask,
               (_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
                *)&l);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&local_118);
    l._M_device = (mutex_type *)local_118._M_ptr;
    l._8_8_ = local_118._M_refcount._M_pi;
    local_118 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 )(ZEXT816(0) << 0x20);
    std::shared_future<void>::operator=
              ((shared_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + local_108),(shared_future<void> *)&l);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&l._M_owns);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    ptVar2 = this->gThreads;
    std::unique_lock<std::mutex>::unique_lock
              (&l,(mutex_type *)((long)&(ptVar2->t)._M_id._M_thread + lVar6));
    __args = &threadTask;
    std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
    emplace_back<std::packaged_task<void()>>
              ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
               ((long)ptVar2 + lVar6 + -0x80),__args);
    std::unique_lock<std::mutex>::unlock(&l);
    std::condition_variable::notify_one();
    iVar5 = iVar5 + partitionCountThread;
    std::unique_lock<std::mutex>::~unique_lock(&l);
    std::packaged_task<void_()>::~packaged_task(&threadTask);
    uVar4 = (ulong)local_124;
    lVar6 = lVar6 + 0xb8;
    lVar3 = local_108 + 0x10;
  }
  lVar6 = 0;
  for (lVar3 = 0; lVar3 < this->kNumThreads; lVar3 = lVar3 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar6),__args);
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartitionAsync(
                                                        const int* bufferIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        int partitionCount,
                                                        double* outSumLogLikelihoodByPartition) {


    int partitionsPerThreadFloor = partitionCount / kNumThreads;
    int partitionsRemainder = partitionCount % kNumThreads;
    int currentPartitionIndex = 0;
    int threadsUsed = (partitionCount < kNumThreads ? partitionCount : kNumThreads);
    for (int i=0; i<threadsUsed; i++) {
        int partitionCountThread = partitionsPerThreadFloor;
        if (partitionsRemainder) {
            partitionCountThread++;
            partitionsRemainder--;
        }

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition, this,
                      &bufferIndices[currentPartitionIndex], &categoryWeightsIndices[currentPartitionIndex],
                      &stateFrequenciesIndices[currentPartitionIndex], &cumulativeScaleIndices[currentPartitionIndex],
                      &partitionIndices[currentPartitionIndex], partitionCountThread,
                      &outSumLogLikelihoodByPartition[currentPartitionIndex]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

        currentPartitionIndex += partitionCountThread;
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}